

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O0

int imsg_compose(imsgbuf *ibuf,u_int32_t type,u_int32_t peerid,pid_t pid,int fd,void *data,
                u_int16_t datalen)

{
  int iVar1;
  imsgbuf *ibuf_00;
  u_int32_t in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  u_int32_t in_R8D;
  ibuf *in_R9;
  ibuf *wbuf;
  undefined6 in_stack_ffffffffffffffc8;
  u_int16_t in_stack_ffffffffffffffce;
  int local_4;
  
  ibuf_00 = (imsgbuf *)
            imsg_create((imsgbuf *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
                        (pid_t)((ulong)in_R9 >> 0x20),(u_int16_t)((ulong)in_R9 >> 0x10));
  if (ibuf_00 == (imsgbuf *)0x0) {
    local_4 = -1;
  }
  else {
    iVar1 = imsg_add(in_R9,ibuf_00,in_stack_ffffffffffffffce);
    if (iVar1 == -1) {
      local_4 = -1;
    }
    else {
      *(u_int32_t *)((ibuf_00->r).buf + 0x28) = in_R8D;
      imsg_close(ibuf_00,(ibuf *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8));
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int
imsg_compose(struct imsgbuf *ibuf, u_int32_t type, u_int32_t peerid,
    pid_t pid, int fd, const void *data, u_int16_t datalen)
{
	struct ibuf	*wbuf;

	if ((wbuf = imsg_create(ibuf, type, peerid, pid, datalen)) == NULL)
		return (-1);

	if (imsg_add(wbuf, data, datalen) == -1)
		return (-1);

	wbuf->fd = fd;

	imsg_close(ibuf, wbuf);

	return (1);
}